

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.h
# Opt level: O0

String * __thiscall
CommandLineOption::describe(String *__return_storage_ptr__,CommandLineOption *this)

{
  char *__s;
  size_t sVar1;
  allocator<char> local_84;
  undefined1 local_83;
  char local_82;
  undefined1 local_81;
  undefined1 *local_80;
  undefined8 local_78;
  string local_70 [55];
  byte local_39;
  String local_38;
  CommandLineOption *local_18;
  CommandLineOption *this_local;
  
  local_18 = this;
  this_local = (CommandLineOption *)__return_storage_ptr__;
  __s = String::operator_cast_to_char_(&this->_longform);
  sVar1 = strlen(__s);
  local_39 = 0;
  if (sVar1 == 0) {
    local_83 = 0x2d;
    local_82 = this->_shortform;
    local_81 = 0;
    local_80 = &local_83;
    local_78 = 3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,local_80,local_78,&local_84);
    String::String(__return_storage_ptr__,(string *)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_84);
  }
  else {
    String::String(&local_38,"--");
    local_39 = 1;
    String::operator+(__return_storage_ptr__,&local_38,&this->_longform);
  }
  if ((local_39 & 1) != 0) {
    String::~String(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

inline String describe() const
	{
		return std::strlen (_longform)
			? (String ("--") + _longform)
			: String ({'-', _shortform, '\0'});
	}